

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O3

void lookForBotCommands(Comment *comment)

{
  Reddit *pRVar1;
  bool bVar2;
  string_view substr;
  string_view substr_00;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [64];
  
  substr._M_str = "!std ignore_me";
  substr._M_len = 0xe;
  bVar2 = Comment::contains(comment,substr);
  if (bVar2) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&ignoredUsers_abi_cxx11_,&comment->author);
    saveData();
    pRVar1 = reddit;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_60 + 0x10),"Alright, not following you anymore",&signature_abi_cxx11_);
    Reddit::comment((Reddit *)(local_60 + 0x30),(string *)pRVar1,&comment->fullName);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(local_60 + 0x30));
    if ((pointer)local_60._16_8_ != (pointer)(local_60 + 0x20)) {
      operator_delete((void *)local_60._16_8_,(ulong)(local_60._32_8_ + 1));
    }
  }
  substr_00._M_str = "!std follow_me";
  substr_00._M_len = 0xe;
  bVar2 = Comment::contains(comment,substr_00);
  if (bVar2) {
    pVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::equal_range(&ignoredUsers_abi_cxx11_._M_t,&comment->author);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_aux(&ignoredUsers_abi_cxx11_._M_t,(_Base_ptr)pVar3.first._M_node,
                   (_Base_ptr)pVar3.second._M_node);
    saveData();
    pRVar1 = reddit;
    std::operator+(&local_80,"Happy to follow you again",&signature_abi_cxx11_);
    Reddit::comment((Reddit *)local_60,(string *)pRVar1,&comment->fullName);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void lookForBotCommands(const Comment& comment) {
    if (comment.contains("!std ignore_me")) {
        ignoredUsers.insert(comment.author);
        saveData();
        reddit->comment(comment.fullName, "Alright, not following you anymore" + signature);
    }

    if (comment.contains("!std follow_me")) {
        ignoredUsers.erase(comment.author);
        saveData();
        reddit->comment(comment.fullName, "Happy to follow you again" + signature);
    }
}